

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedRead::abortRead(BlockedRead *this)

{
  PromiseFulfiller<unsigned_long> *pPVar1;
  AsyncPipe *this_00;
  char (*in_RCX) [29];
  StringPtr cancelReason;
  Array<char> local_190;
  Exception local_178;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  pPVar1 = this->fulfiller;
  _::Debug::makeDescription<char_const(&)[29]>
            ((String *)&local_190,(Debug *)"\"read end of pipe was aborted\"",
             "read end of pipe was aborted",in_RCX);
  Exception::Exception
            (&local_178,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x272,(String *)&local_190);
  (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_178);
  Exception::~Exception(&local_178);
  Array<char>::~Array(&local_190);
  this_00 = this->pipe;
  if ((BlockedRead *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
      pipe.endState(*this);
      pipe.abortRead();
    }